

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrUtils-CPConv_IConv.c
# Opt level: O3

UINT8 CPConv_StrConvert(CPCONV *cpc,size_t *outSize,char **outStr,size_t inSize,char *inStr)

{
  int iVar1;
  UINT8 UVar2;
  size_t sVar3;
  int *piVar4;
  size_t sVar5;
  long lVar6;
  size_t __size;
  char *outPtr;
  size_t remBytesIn;
  char *inPtr;
  size_t remBytesOut;
  char *local_58;
  size_t local_50;
  size_t *local_48;
  char *local_40;
  size_t local_38;
  
  iconv(cpc->hIConv,(char **)0x0,(size_t *)0x0,(char **)0x0,(size_t *)0x0);
  local_50 = inSize;
  if ((inSize == 0) && (local_50 = strlen(inStr), local_50 == 0)) {
    UVar2 = '\x02';
    sVar5 = 0;
  }
  else {
    local_58 = *outStr;
    local_40 = inStr;
    if (local_58 == (char *)0x0) {
      __size = local_50 * 3 >> 1;
      local_58 = (char *)malloc(__size);
      *outStr = local_58;
    }
    else {
      __size = *outSize;
    }
    local_38 = __size;
    sVar3 = iconv(cpc->hIConv,&local_40,&local_50,&local_58,&local_38);
    if (sVar3 == 0xffffffffffffffff) {
      local_48 = outSize;
      piVar4 = __errno_location();
      do {
        outSize = local_48;
        iVar1 = *piVar4;
        if ((iVar1 == 0x54) || (iVar1 == 0x16)) {
          UVar2 = 0x80;
          if ((iVar1 == 0x16) && (local_50 < 2)) {
            iconv(cpc->hIConv,(char **)0x0,(size_t *)0x0,&local_58,&local_38);
            UVar2 = '\x01';
          }
          goto LAB_0017287b;
        }
        lVar6 = (long)local_58 - (long)*outStr;
        __size = __size + local_50 * 2;
        local_58 = (char *)realloc(*outStr,__size);
        *outStr = local_58;
        local_58 = local_58 + lVar6;
        local_38 = __size - lVar6;
        sVar3 = iconv(cpc->hIConv,&local_40,&local_50,&local_58,&local_38);
      } while (sVar3 == 0xffffffffffffffff);
      UVar2 = '\0';
      outSize = local_48;
    }
    else {
      UVar2 = '\0';
    }
LAB_0017287b:
    sVar5 = (long)local_58 - (long)*outStr;
  }
  *outSize = sVar5;
  return UVar2;
}

Assistant:

UINT8 CPConv_StrConvert(CPCONV* cpc, size_t* outSize, char** outStr, size_t inSize, const char* inStr)
{
	size_t outBufSize;
	size_t remBytesIn;
	size_t remBytesOut;
	char* inPtr;
	char* outPtr;
	size_t wrtBytes;
	char resVal;
	
	iconv(cpc->hIConv, NULL, NULL, NULL, NULL);	// reset conversion state
	
	remBytesIn = inSize ? inSize : strlen(inStr);
	inPtr = (char*)&inStr[0];	// const-cast due to a bug in the API
	if (remBytesIn == 0)
	{
		*outSize = 0;
		return 0x02;	// nothing to convert
	}
	
	if (*outStr == NULL)
	{
		outBufSize = remBytesIn * 3 / 2;
		*outStr = (char*)malloc(outBufSize);
	}
	else
	{
		outBufSize = *outSize;
	}
	remBytesOut = outBufSize;
	outPtr = *outStr;
	
	resVal = 0x00;
	wrtBytes = iconv(cpc->hIConv, &inPtr, &remBytesIn, &outPtr, &remBytesOut);
	while(wrtBytes == (size_t)-1)
	{
		if (errno == EILSEQ || errno == EINVAL)
		{
			// invalid encoding
			resVal = 0x80;
			if (errno == EINVAL && remBytesIn <= 1)
			{
				// assume that the string got truncated
				iconv(cpc->hIConv, NULL, NULL, &outPtr, &remBytesOut);
				resVal = 0x01;
			}
			break;
		}
		// errno == E2BIG
		wrtBytes = outPtr - *outStr;
		outBufSize += remBytesIn * 2;
		*outStr = (char*)realloc(*outStr, outBufSize);
		outPtr = *outStr + wrtBytes;
		remBytesOut = outBufSize - wrtBytes;
		
		wrtBytes = iconv(cpc->hIConv, &inPtr, &remBytesIn, &outPtr, &remBytesOut);
	}
	
	*outSize = outPtr - *outStr;
	return resVal;
}